

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_zeropage_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_241840::CpuZeropageTest_rra_zero_sets_n_and_v_Test::TestBody
          (CpuZeropageTest_rra_zero_sets_n_and_v_Test *this)

{
  CpuZeropageTest_rra_zero_sets_n_and_v_Test *this_local;
  
  (this->super_CpuZeropageTest).super_CpuTest.registers.p = '\x02';
  (this->super_CpuZeropageTest).super_CpuTest.registers.a = '@';
  (this->super_CpuZeropageTest).super_CpuTest.expected.a = 0x80;
  (this->super_CpuZeropageTest).super_CpuTest.expected.p = 0xc0;
  (this->super_CpuZeropageTest).super_CpuTest.field_0x114 = 0x80;
  CpuZeropageTest::run_readwrite_instruction(&this->super_CpuZeropageTest,'g','@');
  return;
}

Assistant:

TEST_F(CpuZeropageTest, rra_zero_sets_n_and_v) {
    registers.p = Z_FLAG;
    registers.a = 0b0100'0000;
    expected.a = 0b1000'0000;
    expected.p = N_FLAG | V_FLAG;
    memory_content = 0b1000'0000;
    run_readwrite_instruction(RRA_ZERO, 0b0100'0000);
}